

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ht-spkitable.c
# Opt level: O0

void spki_table_notify_diff(spki_table *new_table,spki_table *old_table,rtr_socket *socket)

{
  long lVar1;
  spki_update_fp p_Var2;
  int iVar3;
  long in_FS_OFFSET;
  key_entry *entry_1;
  tommy_node *current_node_1;
  key_entry *entry;
  tommy_node *current_node;
  spki_update_fp old_table_fp;
  rtr_socket *socket_local;
  spki_table *old_table_local;
  spki_table *new_table_local;
  spki_record record_1;
  spki_record record;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  p_Var2 = old_table->update_fp;
  old_table->update_fp = (spki_update_fp)0x0;
  for (entry = (key_entry *)tommy_list_head(&new_table->list); entry != (key_entry *)0x0;
      entry = *(key_entry **)entry->ski) {
    if ((*(key_entry **)(entry->ski + 0x10))->socket == socket) {
      key_entry_to_spki_record(*(key_entry **)(entry->ski + 0x10),(spki_record *)&record_1.socket);
      iVar3 = spki_table_remove_entry(old_table,(spki_record *)&record_1.socket);
      if (iVar3 == -3) {
        spki_table_notify_clients(new_table,(spki_record *)&record_1.socket,true);
      }
    }
  }
  for (entry_1 = (key_entry *)tommy_list_head(&old_table->list); entry_1 != (key_entry *)0x0;
      entry_1 = *(key_entry **)entry_1->ski) {
    if ((*(key_entry **)(entry_1->ski + 0x10))->socket == socket) {
      key_entry_to_spki_record(*(key_entry **)(entry_1->ski + 0x10),(spki_record *)&new_table_local)
      ;
      spki_table_notify_clients(new_table,(spki_record *)&new_table_local,false);
    }
  }
  old_table->update_fp = p_Var2;
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void spki_table_notify_diff(struct spki_table *new_table, struct spki_table *old_table, const struct rtr_socket *socket)
{
	spki_update_fp old_table_fp;

	// Disable update callback for old_table
	old_table_fp = old_table->update_fp;
	old_table->update_fp = NULL;

	// Iterate new_table and try to delete every entry from the given socket
	// in old_table If the prefix could not be removed it was added in
	// new_table and the update cb must be called
	for (tommy_node *current_node = tommy_list_head(&new_table->list); current_node;
	     current_node = current_node->next) {
		struct key_entry *entry = (struct key_entry *)current_node->data;

		if (entry->socket == socket) {
			struct spki_record record;

			key_entry_to_spki_record(entry, &record);

			if (spki_table_remove_entry(old_table, &record) == SPKI_RECORD_NOT_FOUND)
				spki_table_notify_clients(new_table, &record, true);
		}
	}

	// Iterate old_table and call cb for every remianing entry from the
	// given socket with added false because it is not present in new_table
	for (tommy_node *current_node = tommy_list_head(&old_table->list); current_node;
	     current_node = current_node->next) {
		struct key_entry *entry = (struct key_entry *)current_node->data;

		if (entry->socket == socket) {
			struct spki_record record;

			key_entry_to_spki_record(entry, &record);
			spki_table_notify_clients(new_table, &record, false);
		}
	}

	// Restore original state of old_tables update_fp
	old_table->update_fp = old_table_fp;
}